

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message.c
# Opt level: O1

void do_gop(void *x,int n,char *op,int type,ARMCI_Group group)

{
  char cVar1;
  void *__dest;
  int iVar2;
  void *pvVar3;
  undefined4 in_register_0000000c;
  char *op_00;
  int n_00;
  ARMCI_Group AVar4;
  undefined *puVar5;
  int mpi_type_size;
  ARMCI_Group AStack_84;
  int local_50;
  ARMCI_Group local_4c;
  void *local_48;
  undefined *local_40;
  MPI_Comm local_38;
  
  op_00 = (char *)CONCAT44(in_register_0000000c,type);
  local_50 = 0;
  AVar4 = group;
  local_4c = group;
  local_48 = x;
  if (group == -2) {
    local_38 = (MPI_Comm)&ompi_mpi_comm_self;
  }
  else {
    local_38 = get_comm(&local_4c);
  }
  if (type < -0x66) {
    if (type == -0x133) {
      local_40 = &ompi_mpi_double;
    }
    else {
      if (type != -0x132) {
LAB_0010e0a5:
        iVar2 = 0x1b8d97;
        pvVar3 = (void *)(ulong)(uint)type;
        comex_error("armci_type_to_mpi_type: unrecognized type",type);
        if (iVar2 == 0x151) {
          AStack_84 = -2;
          if (1 < _number_of_procs_per_node) {
            AStack_84 = ARMCI_Node_group;
          }
        }
        else {
          ARMCI_Group_get_default(&AStack_84);
        }
        do_gop(pvVar3,n_00,op_00,AVar4,AStack_84);
        return;
      }
      local_40 = &ompi_mpi_float;
    }
  }
  else if (type == -0x66) {
    local_40 = &ompi_mpi_long_long_int;
  }
  else if (type == -99) {
    local_40 = &ompi_mpi_int;
  }
  else {
    if (type != -0x65) goto LAB_0010e0a5;
    local_40 = &ompi_mpi_long;
  }
  MPI_Type_size(local_40,&local_50);
  cVar1 = *op;
  if (cVar1 == '+') {
    puVar5 = &ompi_mpi_op_sum;
  }
  else {
    iVar2 = strncmp(op,"max",3);
    puVar5 = &ompi_mpi_op_max;
    if (iVar2 != 0) {
      iVar2 = strncmp(op,"min",3);
      puVar5 = &ompi_mpi_op_min;
      if (iVar2 != 0) {
        if (cVar1 == '*') {
          puVar5 = &ompi_mpi_op_prod;
        }
        else {
          iVar2 = strncmp(op,"absmin",6);
          if (iVar2 != 0) {
            iVar2 = strncmp(op,"absmax",6);
            puVar5 = &ompi_mpi_op_max;
            if (iVar2 != 0) {
              iVar2 = strncmp(op,"or",2);
              puVar5 = &ompi_mpi_op_bor;
              if (iVar2 != 0) {
                iVar2 = strncmp(op,"&&",2);
                puVar5 = &ompi_mpi_op_land;
                if (iVar2 != 0) {
                  iVar2 = strncmp(op,"land",4);
                  if (iVar2 != 0) {
                    iVar2 = strncmp(op,"||",2);
                    puVar5 = &ompi_mpi_op_lor;
                    if (iVar2 != 0) {
                      iVar2 = strncmp(op,"lor",3);
                      if ((iVar2 != 0) && (puVar5 = &ompi_mpi_op_band, cVar1 != '&')) {
                        iVar2 = strncmp(op,"band",4);
                        if (iVar2 != 0) {
                          if (cVar1 == '|') {
                            puVar5 = &ompi_mpi_op_bor;
                          }
                          else {
                            iVar2 = strncmp(op,"bor",3);
                            puVar5 = &ompi_mpi_op_bor;
                            if (iVar2 != 0) {
                              comex_error("Unsupported gop operation",1);
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  iVar2 = strncmp(op,"absmin",6);
  if (iVar2 != 0) {
    iVar2 = strncmp(op,"absmax",6);
    if (iVar2 != 0) goto LAB_0010dff2;
  }
  do_abs(local_48,n,type);
LAB_0010dff2:
  pvVar3 = malloc((long)local_50 * (long)n);
  if (pvVar3 == (void *)0x0) {
    __assert_fail("result",
                  "/workspace/llm4binary/github/license_c_cmakelists/GlobalArrays[P]ga/comex/src-armci/message.c"
                  ,0xd7,"void do_gop(void *, int, char *, int, ARMCI_Group)");
  }
  if (group != -2) {
    comex_barrier(group);
  }
  __dest = local_48;
  iVar2 = MPI_Allreduce(local_48,pvVar3,n,local_40,puVar5,local_38);
  if (iVar2 == 0) {
    memcpy(__dest,pvVar3,(long)local_50 * (long)n);
    free(pvVar3);
    return;
  }
  __assert_fail("rc == MPI_SUCCESS",
                "/workspace/llm4binary/github/license_c_cmakelists/GlobalArrays[P]ga/comex/src-armci/message.c"
                ,0xdd,"void do_gop(void *, int, char *, int, ARMCI_Group)");
}

Assistant:

static void do_gop(void *x, int n, char* op, int type, ARMCI_Group group)
{
    MPI_Comm comm = MPI_COMM_NULL;
    int mpi_type_size = 0;
    MPI_Datatype mpi_type = MPI_DATATYPE_NULL;
    int rc = 0;
    void *result = NULL;
    MPI_Op mpi_op = MPI_OP_NULL;

    if (ARMCI_GROUP_SELF == group) {
        comm = MPI_COMM_SELF;
    }
    else {
        comm = get_comm(&group);
    }
    mpi_type = armci_type_to_mpi_type(type);
    MPI_Type_size(mpi_type, &mpi_type_size);
    mpi_op = armci_op_to_mpi_op(op);

    if (strncmp(op, "absmin", 6) == 0) {
        do_abs(x, n, type);
    }
    else if (strncmp(op, "absmax", 6) == 0) {
        do_abs(x, n, type);
    }
        
    result = malloc(n*mpi_type_size);
    assert(result);

    if (ARMCI_GROUP_SELF != group) {
        comex_barrier(group);
    }
    rc = MPI_Allreduce(x, result, n, mpi_type, mpi_op, comm); 
    assert(rc == MPI_SUCCESS);

    memcpy(x, result, mpi_type_size * n);
    free(result);
}